

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O0

int Abc_ObjChangeEval(Abc_Obj_t *pObj,Vec_Int_t *vInfo,Vec_Int_t *vFirst,int InvArea,int *pfUseInv)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pFanin;
  int fUseInv;
  int iFanin;
  int Gain;
  int fNeedInv;
  int i;
  int *pNodeInfo;
  int *pFanInfo;
  int iNodeCell;
  int iFanCell;
  Abc_Obj_t *pNext;
  int *pfUseInv_local;
  int InvArea_local;
  Vec_Int_t *vFirst_local;
  Vec_Int_t *vInfo_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Mio_GateReadCell((Mio_Gate_t *)(pObj->field_5).pData);
  iVar1 = Vec_IntEntry(vFirst,iVar1);
  piVar3 = Vec_IntEntryP(vInfo,iVar1);
  iFanin = 0;
  iVar1 = Abc_ObjFaninNum(pObj);
  iVar2 = Abc_NodeIsInv(pObj);
  if (iVar1 < 1) {
    __assert_fail("iFanin > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmArea.c"
                  ,0xe2,"int Abc_ObjChangeEval(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, int, int *)");
  }
  *pfUseInv = 0;
  if (piVar3[iVar1 * 3] == -1) {
    pObj_local._4_4_ = 0;
  }
  else {
    fUseInv = InvArea;
    if (iVar2 == 0) {
      fUseInv = piVar3[iVar1 * 3 + 2];
    }
    for (Gain = 0; iVar1 = Abc_ObjFanoutNum(pObj), Gain < iVar1; Gain = Gain + 1) {
      pNode = Abc_ObjFanout(pObj,Gain);
      if (iVar2 != 0) {
        pFanin = Abc_ObjFanin0(pObj);
        iVar1 = Abc_NodeFindFanin(pNode,pFanin);
        if (-1 < iVar1) {
          return 0;
        }
      }
      iVar1 = Abc_ObjHasDupFanins(pNode);
      if (iVar1 != 0) {
        return 0;
      }
      iVar1 = Abc_ObjIsNode(pNode);
      if ((iVar1 == 0) || (iVar1 = Abc_NodeIsBuf(pNode), iVar1 != 0)) {
        iFanin = 1;
      }
      else {
        iVar1 = Abc_NodeIsInv(pNode);
        if (iVar1 == 0) {
          iVar1 = Mio_GateReadCell((Mio_Gate_t *)(pNode->field_5).pData);
          iVar1 = Vec_IntEntry(vFirst,iVar1);
          piVar3 = Vec_IntEntryP(vInfo,iVar1);
          iVar1 = Abc_NodeFindFanin(pNode,pObj);
          if (piVar3[iVar1 * 3] == -1) {
            iFanin = 1;
          }
          else {
            fUseInv = piVar3[iVar1 * 3 + 2] + fUseInv;
          }
        }
        else {
          iVar1 = Abc_NodeCheckFanoutHasFanin(pNode,pObj);
          if (-1 < iVar1) {
            return 0;
          }
          fUseInv = InvArea + fUseInv;
        }
      }
    }
    if (iFanin != 0) {
      fUseInv = fUseInv - InvArea;
    }
    *pfUseInv = iFanin;
    pObj_local._4_4_ = fUseInv;
  }
  return pObj_local._4_4_;
}

Assistant:

int Abc_ObjChangeEval( Abc_Obj_t * pObj, Vec_Int_t * vInfo, Vec_Int_t * vFirst, int InvArea, int * pfUseInv )
{
    Abc_Obj_t * pNext;
    //Mio_Gate_t * pGate = (Mio_Gate_t *)pObj->pData;
    int iFanCell, iNodeCell = Mio_GateReadCell( (Mio_Gate_t *)pObj->pData );
    int * pFanInfo, * pNodeInfo = Vec_IntEntryP( vInfo, Vec_IntEntry(vFirst, iNodeCell) );
    int i, fNeedInv = 0, Gain = 0, iFanin = Abc_ObjFaninNum(pObj), fUseInv = Abc_NodeIsInv(pObj);
    assert( iFanin > 0 );
    *pfUseInv = 0;
    if ( pNodeInfo[3*iFanin] == -1 )
        return 0;
    if ( fUseInv )
        Gain = InvArea;
    else
        Gain = pNodeInfo[3*iFanin+2];
    Abc_ObjForEachFanout( pObj, pNext, i )
    {
        if ( fUseInv && Abc_NodeFindFanin(pNext, Abc_ObjFanin0(pObj)) >= 0 )
            return 0;
        if ( Abc_ObjHasDupFanins(pNext) )
            return 0;
        if ( !Abc_ObjIsNode(pNext) || Abc_NodeIsBuf(pNext) )
        {
            fNeedInv = 1;
            continue;
        }
        if ( Abc_NodeIsInv(pNext) )
        {
            if ( Abc_NodeCheckFanoutHasFanin(pNext, pObj) >= 0 )
                return 0;
            Gain += InvArea;
            continue;
        }
        iFanCell = Mio_GateReadCell( (Mio_Gate_t *)pNext->pData );
        pFanInfo = Vec_IntEntryP( vInfo, Vec_IntEntry(vFirst, iFanCell) );
        iFanin   = Abc_NodeFindFanin( pNext, pObj );
        if ( pFanInfo[3*iFanin] == -1 )
        {
            fNeedInv = 1;
            continue;
        }
        Gain += pFanInfo[3*iFanin+2];
    }
    if ( fNeedInv )
        Gain -= InvArea;
    *pfUseInv = fNeedInv;
    return Gain;
}